

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O2

QAbstractItemModel * createTableModel(QObject *parent)

{
  int iVar1;
  int iVar2;
  QStandardItemModel *this;
  int a;
  anon_union_24_3_e3d07ef4_for_data local_e8;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  undefined1 local_48 [24];
  
  this = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(this,parent);
  local_e8._forAlignment = -NAN;
  local_e8._8_8_ = 0;
  local_e8._16_8_ = 0;
  (**(code **)(*(long *)this + 0xf8))(this,0,5,&local_e8);
  local_e8._forAlignment = -NAN;
  local_e8._8_8_ = 0;
  local_e8._16_8_ = 0;
  a = 0;
  (**(code **)(*(long *)this + 0x100))(this,0,3,&local_e8);
  while( true ) {
    local_e8._forAlignment = -NAN;
    local_e8._8_8_ = 0;
    local_e8._16_8_ = 0;
    iVar1 = (**(code **)(*(long *)this + 0x78))();
    if (iVar1 <= a) break;
    iVar1 = 0;
    while( true ) {
      local_e8._forAlignment = -NAN;
      local_e8._8_8_ = 0;
      local_e8._16_8_ = 0;
      iVar2 = (**(code **)(*(long *)this + 0x80))();
      if (iVar2 <= iVar1) break;
      local_c8 = 0xffffffffffffffff;
      local_c0 = 0;
      uStack_b8 = 0;
      (**(code **)(*(long *)this + 0x60))(local_48,this,a,iVar1,&local_c8);
      local_b0.d = (Data *)0x0;
      local_b0.ptr = L"%1,%2";
      local_b0.size = 5;
      local_98.d = (Data *)0x0;
      local_98.ptr = (char16_t *)0x0;
      local_98.size = 0;
      QString::arg((QString *)&local_78,(QString *)&local_b0,a,0,10,(QChar)0x20);
      QString::arg((QString *)&local_60,(QString *)&local_78,iVar1,0,10,(QChar)0x20);
      QVariant::QVariant((QVariant *)&local_e8,(QString *)&local_60);
      (**(code **)(*(long *)this + 0x98))(this,local_48,&local_e8,2);
      QVariant::~QVariant((QVariant *)&local_e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      local_c8 = 0xffffffffffffffff;
      local_c0 = 0;
      uStack_b8 = 0;
      (**(code **)(*(long *)this + 0x60))(local_48,this,a,iVar1,&local_c8);
      QVariant::QVariant((QVariant *)&local_e8,a);
      (**(code **)(*(long *)this + 0x98))(this,local_48,&local_e8,0x100);
      QVariant::~QVariant((QVariant *)&local_e8);
      local_c8 = 0xffffffffffffffff;
      local_c0 = 0;
      uStack_b8 = 0;
      (**(code **)(*(long *)this + 0x60))(local_48,this,a,iVar1,&local_c8);
      QVariant::QVariant((QVariant *)&local_e8,iVar1);
      (**(code **)(*(long *)this + 0x98))(this,local_48,&local_e8,0x101);
      QVariant::~QVariant((QVariant *)&local_e8);
      iVar1 = iVar1 + 1;
    }
    a = a + 1;
  }
  return (QAbstractItemModel *)this;
}

Assistant:

QAbstractItemModel *createTableModel(QObject *parent)
{
    QAbstractItemModel *result = nullptr;
#ifdef COMPLEX_MODEL_SUPPORT
    result = new ComplexModel(parent);
    result->insertRows(0, 5);
    result->insertColumns(0, 3);
    for (int i = 0; i < result->rowCount(); ++i) {
        for (int j = 0; j < result->columnCount(); ++j) {
            result->setData(result->index(i, j), QStringLiteral("%1,%2").arg(i).arg(j), Qt::EditRole);
            result->setData(result->index(i, j), i, Qt::UserRole);
            result->setData(result->index(i, j), j, Qt::UserRole + 1);
        }
    }
#endif
    return result;
}